

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwSetWindowTitle(GLFWwindow *handle,char *title)

{
  _GLFWwindow *window;
  char *title_local;
  GLFWwindow *handle_local;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abhisarshukla[P]opengl-cmake-template/libs/glfw-3.3.4/src/window.c"
                  ,0x1ef,"void glfwSetWindowTitle(GLFWwindow *, const char *)");
  }
  if (title != (char *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      _glfwPlatformSetWindowTitle((_GLFWwindow *)handle,title);
    }
    return;
  }
  __assert_fail("title != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abhisarshukla[P]opengl-cmake-template/libs/glfw-3.3.4/src/window.c"
                ,0x1f0,"void glfwSetWindowTitle(GLFWwindow *, const char *)");
}

Assistant:

GLFWAPI void glfwSetWindowTitle(GLFWwindow* handle, const char* title)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);
    assert(title != NULL);

    _GLFW_REQUIRE_INIT();
    _glfwPlatformSetWindowTitle(window, title);
}